

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int get_read_type(coda_cursor *cursor,coda_native_type *read_type)

{
  int iVar1;
  coda_native_type cVar2;
  int *piVar3;
  coda_type *pcVar4;
  
  pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar4->format) {
    pcVar4 = *(coda_type **)&pcVar4->type_class;
  }
  iVar1 = pcVar4->type_class;
  piVar3 = (int *)__tls_get_addr(&PTR_001d8ea8);
  if ((((iVar1 == 2) || (iVar1 == 3)) && (*piVar3 != 0)) && (pcVar4[1].name != (char *)0x0)) {
    cVar2 = coda_native_type_double;
  }
  else {
    cVar2 = pcVar4->read_type;
  }
  *read_type = cVar2;
  return cVar2;
}

Assistant:

static int get_read_type(const coda_cursor *cursor, coda_native_type *read_type)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if ((type->type_class == coda_integer_class || type->type_class == coda_real_class) &&
        coda_option_perform_conversions && ((coda_type_number *)type)->conversion != NULL)
    {
        *read_type = coda_native_type_double;
    }
    else
    {
        *read_type = type->read_type;
    }

    return 0;
}